

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

void __thiscall
wallet::SelectionResult::RecalculateWaste
          (SelectionResult *this,CAmount min_viable_change,CAmount change_cost,CAmount change_fee)

{
  long lVar1;
  bool bVar2;
  CAmount CVar3;
  COutput *in_RDI;
  long in_FS_OFFSET;
  CAmount selected_effective_value;
  COutput *coin;
  shared_ptr<wallet::COutput> *coin_ptr;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  CAmount waste;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffff78;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_ffffffffffffff80;
  CAmount in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffff98;
  SelectionResult *in_stack_ffffffffffffffa0;
  uint32_t local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::
          set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          ::empty(in_stack_ffffffffffffff78);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_selected_inputs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                  ,0x33f,
                  "void wallet::SelectionResult::RecalculateWaste(const CAmount, const CAmount, const CAmount)"
                 );
  }
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::begin(in_stack_ffffffffffffff80);
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::end(in_stack_ffffffffffffff80);
  while (bVar2 = std::operator==((_Self *)in_RDI,(_Self *)in_stack_ffffffffffffff80),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffa0 =
         (SelectionResult *)
         std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>::operator*
                   ((_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *)
                    in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff98 =
         std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )in_RDI);
    COutput::GetFee(in_RDI);
    std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>::operator++
              ((_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *)
               in_stack_ffffffffffffff78);
  }
  CVar3 = GetChange(in_stack_ffffffffffffffa0,(CAmount)in_stack_ffffffffffffff98,
                    in_stack_ffffffffffffff90);
  if (CVar3 == 0) {
    if (((in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] & 1) == 0) {
      in_stack_ffffffffffffff80 =
           (set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)GetSelectedValue((SelectionResult *)in_stack_ffffffffffffff98);
    }
    else {
      in_stack_ffffffffffffff80 =
           (set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
            *)GetSelectedEffectiveValue((SelectionResult *)in_stack_ffffffffffffff98);
    }
    if ((long)in_stack_ffffffffffffff80 <
        *(long *)((in_RDI->outpoint).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10)) {
      __assert_fail("selected_effective_value >= m_target",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.cpp"
                    ,0x351,
                    "void wallet::SelectionResult::RecalculateWaste(const CAmount, const CAmount, const CAmount)"
                   );
    }
  }
  std::optional<long>::optional<long_&,_true>
            (&in_RDI->effective_value,(long *)in_stack_ffffffffffffff80);
  (in_RDI->outpoint).n = local_18;
  *(undefined4 *)&in_RDI->field_0x44 = uStack_14;
  *(undefined4 *)&(in_RDI->txout).nValue = uStack_10;
  *(undefined4 *)((long)&(in_RDI->txout).nValue + 4) = uStack_c;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void SelectionResult::RecalculateWaste(const CAmount min_viable_change, const CAmount change_cost, const CAmount change_fee)
{
    // This function should not be called with empty inputs as that would mean the selection failed
    assert(!m_selected_inputs.empty());

    // Always consider the cost of spending an input now vs in the future.
    CAmount waste = 0;
    for (const auto& coin_ptr : m_selected_inputs) {
        const COutput& coin = *coin_ptr;
        waste += coin.GetFee() - coin.long_term_fee;
    }
    // Bump fee of whole selection may diverge from sum of individual bump fees
    waste -= bump_fee_group_discount;

    if (GetChange(min_viable_change, change_fee)) {
        // if we have a minimum viable amount after deducting fees, account for
        // cost of creating and spending change
        waste += change_cost;
    } else {
        // When we are not making change (GetChange(…) == 0), consider the excess we are throwing away to fees
        CAmount selected_effective_value = m_use_effective ? GetSelectedEffectiveValue() : GetSelectedValue();
        assert(selected_effective_value >= m_target);
        waste += selected_effective_value - m_target;
    }

    m_waste = waste;
}